

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O2

size_t x11_send(Channel *chan,_Bool is_stderr,void *vdata,size_t len)

{
  undefined1 uVar1;
  int iVar2;
  ChannelVtable *__s1;
  long *blk;
  long lVar3;
  _Bool _Var4;
  ushort uVar5;
  uint32_t uVar6;
  ChannelVtable *pCVar7;
  void *pvVar8;
  size_t sVar9;
  undefined8 *puVar10;
  int *piVar11;
  long lVar12;
  time_t tVar13;
  uint32_t *e;
  uint32_t *puVar14;
  uint *puVar15;
  SockAddr *addr;
  Conf *conf;
  byte *pbVar16;
  ushort uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  char *pcVar21;
  int socketdatalen;
  X11Connection *local_d0;
  uint32_t *local_c8;
  ulong local_c0;
  unsigned_long peer_ip;
  int greeting_len;
  char new_peer_addr [32];
  undefined4 local_80 [2];
  undefined8 local_78;
  int local_70;
  undefined8 local_58 [5];
  
  if (chan->vt != &X11Connection_channelvt) {
    __assert_fail("chan->vt == &X11Connection_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x1ce,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
  }
  while( true ) {
    iVar2 = *(int *)&chan[-4].vt;
    if (len == 0) break;
    if (0xb < iVar2) goto LAB_0012de7a;
    uVar1 = *vdata;
    vdata = (void *)((long)vdata + 1);
    *(int *)&chan[-4].vt = iVar2 + 1;
    *(undefined1 *)((long)&chan[-7].vt + (long)iVar2) = uVar1;
    len = len - 1;
  }
  if (iVar2 < 0xc) {
    return 0;
  }
LAB_0012de7a:
  if (chan[-5].vt == (ChannelVtable *)0x0) {
    if (*(char *)&chan[-7].vt == 'B') {
      uVar17 = *(ushort *)((long)&chan[-7].vt + 6);
      uVar17 = uVar17 << 8 | uVar17 >> 8;
      uVar5 = (ushort)chan[-7].initial_fixed_window_size;
      uVar5 = uVar5 << 8 | uVar5 >> 8;
    }
    else {
      uVar17 = *(ushort *)((long)&chan[-7].vt + 6);
      uVar5 = (ushort)chan[-7].initial_fixed_window_size;
    }
    *(uint *)((long)&chan[-4].vt + 4) = (uint)uVar17;
    *(uint *)&chan[-4].field_0xc = (uint)uVar5;
    uVar20 = uVar17 + 3 & 0xfffffffc;
    chan[-4].initial_fixed_window_size = uVar20;
    *(uint *)&chan[-3].vt = uVar5 + 3 & 0xfffffffc;
    pCVar7 = (ChannelVtable *)safemalloc((ulong)(uVar20 + 1),1,0);
    chan[-5].vt = pCVar7;
    pvVar8 = safemalloc((long)*(int *)&chan[-3].vt,1,0);
    *(void **)&chan[-5].initial_fixed_window_size = pvVar8;
  }
  while (len != 0) {
    iVar2 = *(int *)&chan[-4].vt;
    if ((int)(chan[-4].initial_fixed_window_size + 0xc) <= iVar2) break;
    uVar1 = *vdata;
    vdata = (void *)((long)vdata + 1);
    *(int *)&chan[-4].vt = iVar2 + 1;
    *(undefined1 *)((long)chan[-5].vt + (long)iVar2 + -0xc) = uVar1;
    len = len - 1;
  }
  lVar19 = 0;
  while( true ) {
    iVar2 = *(int *)&chan[-4].vt;
    iVar18 = *(int *)&chan[-3].vt + chan[-4].initial_fixed_window_size + 0xc;
    if ((len - lVar19 == 0) || (iVar18 <= iVar2)) break;
    uVar1 = *(undefined1 *)((long)vdata + lVar19);
    lVar12 = *(long *)&chan[-5].initial_fixed_window_size;
    *(int *)&chan[-4].vt = iVar2 + 1;
    *(undefined1 *)(lVar12 + (int)((iVar2 - chan[-4].initial_fixed_window_size) + -0xc)) = uVar1;
    lVar19 = lVar19 + 1;
  }
  if (iVar2 < iVar18) {
    return 0;
  }
  if (*(char *)((long)&chan[-3].vt + 4) != '\0') goto LAB_0012df76;
  if (*(char *)&chan[-7].vt == 'B') {
    uVar17 = *(ushort *)((long)&chan[-7].vt + 2);
    uVar17 = uVar17 << 8 | uVar17 >> 8;
    uVar5 = *(ushort *)((long)&chan[-7].vt + 4);
    uVar5 = uVar5 << 8 | uVar5 >> 8;
  }
  else {
    uVar17 = *(ushort *)((long)&chan[-7].vt + 2);
    uVar5 = *(ushort *)((long)&chan[-7].vt + 4);
  }
  if (chan[-1].vt != (ChannelVtable *)0x0) {
    __assert_fail("!xconn->s",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c",
                  0x20a,"size_t x11_send(Channel *, _Bool, const void *, size_t)");
  }
  *(undefined1 *)((long)&(chan[-5].vt)->free + (long)*(int *)((long)&chan[-4].vt + 4)) = 0;
  peer_ip = 0;
  _Var4 = x11_parse_ip(*(char **)&chan[-3].initial_fixed_window_size,&peer_ip);
  if (_Var4) {
    uVar20 = *(uint *)&chan[-2].vt;
  }
  else {
    uVar20 = 0xffffffff;
  }
  local_c0 = peer_ip;
  pCVar7 = chan[-6].vt;
  __s1 = chan[-5].vt;
  blk = *(long **)&chan[-5].initial_fixed_window_size;
  iVar2 = *(int *)&chan[-4].field_0xc;
  local_d0 = (X11Connection *)(chan + -7);
  iVar18 = strcmp((char *)__s1,"MIT-MAGIC-COOKIE-1");
  if (iVar18 == 0) {
    local_80[0] = 1;
    puVar10 = &local_78;
    local_70 = iVar2;
  }
  else {
    iVar18 = strcmp((char *)__s1,"XDM-AUTHORIZATION-1");
    if (iVar18 != 0) {
      pcVar21 = "Unsupported authorisation protocol";
      goto LAB_0012e17f;
    }
    local_80[0] = 2;
    puVar10 = local_58;
  }
  *puVar10 = blk;
  piVar11 = (int *)find234((tree234 *)pCVar7,local_80,(cmpfn234)0x0);
  if (piVar11 == (int *)0x0) {
    pcVar21 = "Authorisation not recognised";
LAB_0012e17f:
    x11_send_init_error(local_d0,pcVar21);
    return 0;
  }
  if (*piVar11 == 2) {
    if (iVar2 == 0x18) {
      if (uVar20 == 0xffffffff) {
        pcVar21 = "cannot do XDM-AUTHORIZATION-1 without remote address data";
      }
      else {
        des_decrypt_xdmauth((void *)(*(long *)(piVar11 + 2) + 9),blk,0x18);
        pcVar21 = "XDM-AUTHORIZATION-1 data failed check";
        if (**(long **)(piVar11 + 2) == *blk) {
          local_c8 = (uint32_t *)(blk + 1);
          uVar6 = GET_32BIT_MSB_FIRST(local_c8);
          if ((local_c0 == uVar6) &&
             ((ushort)(*(ushort *)((long)blk + 0xc) << 8 | *(ushort *)((long)blk + 0xc) >> 8) ==
              uVar20)) {
            uVar6 = GET_32BIT_MSB_FIRST((void *)((long)blk + 0xe));
            lVar12 = 0;
            do {
              if (lVar12 == 6) {
                tVar13 = time((time_t *)0x0);
                if (((ulong)uVar6 - tVar13) - 0x4b1 < 0xfffffffffffff69f) {
                  pcVar21 = "XDM-AUTHORIZATION-1 time stamp was too far out";
                }
                else {
                  e = (uint32_t *)safemalloc(1,0xc,0);
                  *e = uVar6;
                  *(short *)(e + 2) = (short)local_c8[1];
                  e[1] = *local_c8;
                  if (*(tree234 **)(piVar11 + 0xc) == (tree234 *)0x0) {
                    __assert_fail("auth->xdmseen != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                                  ,0xf0,
                                  "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                                 );
                  }
                  puVar14 = (uint32_t *)add234(*(tree234 **)(piVar11 + 0xc),e);
                  if (puVar14 == e) goto LAB_0012e22f;
                  safefree(e);
                  pcVar21 = "XDM-AUTHORIZATION-1 data replayed";
                }
                break;
              }
              lVar3 = lVar12 + 0x12;
              lVar12 = lVar12 + 1;
            } while (*(char *)((long)blk + lVar3) == '\0');
          }
        }
      }
    }
    else {
      pcVar21 = "XDM-AUTHORIZATION-1 data was wrong length";
    }
    goto LAB_0012e17f;
  }
LAB_0012e26b:
  if (*(long *)(piVar11 + 0x10) != 0) {
    (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x30))
              (*(long **)&chan[-2].initial_fixed_window_size,*(long *)(piVar11 + 0x10),
               *(undefined8 *)(piVar11 + 0x12),*(undefined8 *)&chan[-3].initial_fixed_window_size,
               *(undefined4 *)&chan[-2].vt,*(undefined1 *)&chan[-7].vt,uVar17,uVar5,
               (undefined1 *)((long)vdata + lVar19),(int)len - (int)lVar19);
    return 0;
  }
  chan->initial_fixed_window_size = 0;
  (**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x28))();
  lVar12 = *(long *)(piVar11 + 0xe);
  *(long *)&chan[-6].initial_fixed_window_size = lVar12;
  addr = sk_addr_dup(*(SockAddr **)(lVar12 + 0x20));
  pcVar21 = *(char **)(*(long *)&chan[-6].initial_fixed_window_size + 0x30);
  iVar2 = *(int *)(*(long *)&chan[-6].initial_fixed_window_size + 0x28);
  conf = (Conf *)(**(code **)(**(long **)&chan[-2].initial_fixed_window_size + 0x20))();
  pCVar7 = (ChannelVtable *)
           new_connection(addr,pcVar21,iVar2,false,true,false,false,
                          (Plug *)&chan[-1].initial_fixed_window_size,conf,(Interactor *)0x0);
  chan[-1].vt = pCVar7;
  pcVar21 = (*((SocketVtable *)pCVar7->free)->socket_error)((Socket *)pCVar7);
  if (pcVar21 != (char *)0x0) {
    pcVar21 = dupprintf("unable to connect to forwarded X server: %s",pcVar21);
    x11_send_init_error(local_d0,pcVar21);
    safefree(pcVar21);
    return 0;
  }
  socketdatalen = 0;
  pbVar16 = (byte *)sk_getxdmdata((Socket *)chan[-1].vt,&socketdatalen);
  if ((pbVar16 == (byte *)0x0) || (socketdatalen != 6)) {
    builtin_strncpy(new_peer_addr,"0.0.0.0",8);
    uVar20 = 0;
  }
  else {
    sprintf(new_peer_addr,"%d.%d.%d.%d",(ulong)*pbVar16,(ulong)pbVar16[1],(ulong)pbVar16[2],
            (ulong)pbVar16[3]);
    uVar20 = (uint)(ushort)(*(ushort *)(pbVar16 + 4) << 8 | *(ushort *)(pbVar16 + 4) >> 8);
  }
  lVar12 = *(long *)&chan[-6].initial_fixed_window_size;
  pvVar8 = x11_make_greeting((uint)*(byte *)&chan[-7].vt,(uint)uVar17,(uint)uVar5,
                             *(int *)(lVar12 + 0x38),*(void **)(lVar12 + 0x40),
                             *(int *)(lVar12 + 0x48),new_peer_addr,uVar20,&greeting_len);
  (**(code **)((chan[-1].vt)->free + 0x10))(chan[-1].vt,pvVar8,(long)greeting_len);
  smemclr(pvVar8,(long)greeting_len);
  safefree(pvVar8);
  *(undefined1 *)((long)&chan[-3].vt + 4) = 1;
LAB_0012df76:
  sVar9 = (**(code **)((chan[-1].vt)->free + 0x10))
                    (chan[-1].vt,(undefined1 *)((long)vdata + lVar19),len - lVar19);
  return sVar9;
LAB_0012e22f:
  while( true ) {
    puVar15 = (uint *)index234(*(tree234 **)(piVar11 + 0xc),0);
    if (puVar15 == (uint *)0x0) {
      __assert_fail("seen != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0xf9,
                    "const char *x11_verify(unsigned long, int, tree234 *, char *, unsigned char *, int, struct X11FakeAuth **)"
                   );
    }
    if ((ulong)uVar6 - (ulong)*puVar15 < 0x4b1) break;
    pvVar8 = delpos234(*(tree234 **)(piVar11 + 0xc),0);
    safefree(pvVar8);
  }
  goto LAB_0012e26b;
}

Assistant:

static size_t x11_send(
    Channel *chan, bool is_stderr, const void *vdata, size_t len)
{
    assert(chan->vt == &X11Connection_channelvt);
    X11Connection *xconn = container_of(chan, X11Connection, chan);
    const char *data = (const char *)vdata;

    /*
     * Read the first packet.
     */
    while (len > 0 && xconn->data_read < 12)
        xconn->firstpkt[xconn->data_read++] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12)
        return 0;

    /*
     * If we have not allocated the auth_protocol and auth_data
     * strings, do so now.
     */
    if (!xconn->auth_protocol) {
        char endian = xconn->firstpkt[0];
        xconn->auth_plen = GET_16BIT_X11(endian, xconn->firstpkt + 6);
        xconn->auth_dlen = GET_16BIT_X11(endian, xconn->firstpkt + 8);
        xconn->auth_psize = (xconn->auth_plen + 3) & ~3;
        xconn->auth_dsize = (xconn->auth_dlen + 3) & ~3;
        /* Leave room for a terminating zero, to make our lives easier. */
        xconn->auth_protocol = snewn(xconn->auth_psize + 1, char);
        xconn->auth_data = snewn(xconn->auth_dsize, unsigned char);
    }

    /*
     * Read the auth_protocol and auth_data strings.
     */
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize)
        xconn->auth_protocol[xconn->data_read++ - 12] = (len--, *data++);
    while (len > 0 &&
           xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        xconn->auth_data[xconn->data_read++ - 12 -
                      xconn->auth_psize] = (unsigned char) (len--, *data++);
    if (xconn->data_read < 12 + xconn->auth_psize + xconn->auth_dsize)
        return 0;

    /*
     * If we haven't verified the authorisation, do so now.
     */
    if (!xconn->verified) {
        const char *err;
        struct X11FakeAuth *auth_matched = NULL;
        unsigned long peer_ip;
        int peer_port;
        int protomajor, protominor;
        void *greeting;
        int greeting_len;
        unsigned char *socketdata;
        int socketdatalen;
        char new_peer_addr[32];
        int new_peer_port;
        char endian = xconn->firstpkt[0];

        protomajor = GET_16BIT_X11(endian, xconn->firstpkt + 2);
        protominor = GET_16BIT_X11(endian, xconn->firstpkt + 4);

        assert(!xconn->s);

        xconn->auth_protocol[xconn->auth_plen] = '\0';  /* ASCIZ */

        peer_ip = 0;                   /* placate optimiser */
        if (x11_parse_ip(xconn->peer_addr, &peer_ip))
            peer_port = xconn->peer_port;
        else
            peer_port = -1; /* signal no peer address data available */

        err = x11_verify(peer_ip, peer_port,
                         xconn->authtree, xconn->auth_protocol,
                         xconn->auth_data, xconn->auth_dlen, &auth_matched);
        if (err) {
            x11_send_init_error(xconn, err);
            return 0;
        }
        assert(auth_matched);

        /*
         * If this auth points to a connection-sharing downstream
         * rather than an X display we know how to connect to
         * directly, pass it off to the sharing module now. (This will
         * have the side effect of freeing xconn.)
         */
        if (auth_matched->share_cs) {
            sshfwd_x11_sharing_handover(xconn->c, auth_matched->share_cs,
                                        auth_matched->share_chan,
                                        xconn->peer_addr, xconn->peer_port,
                                        xconn->firstpkt[0],
                                        protomajor, protominor, data, len);
            return 0;
        }

        /*
         * Now we know we're going to accept the connection, and what
         * X display to connect to. Actually connect to it.
         */
        xconn->chan.initial_fixed_window_size = 0;
        sshfwd_window_override_removed(xconn->c);
        xconn->disp = auth_matched->disp;
        xconn->s = new_connection(sk_addr_dup(xconn->disp->addr),
                                  xconn->disp->realhost, xconn->disp->port,
                                  false, true, false, false, &xconn->plug,
                                  sshfwd_get_conf(xconn->c), NULL);
        if ((err = sk_socket_error(xconn->s)) != NULL) {
            char *err_message = dupprintf("unable to connect to"
                                          " forwarded X server: %s", err);
            x11_send_init_error(xconn, err_message);
            sfree(err_message);
            return 0;
        }

        /*
         * Write a new connection header containing our replacement
         * auth data.
         */
        socketdatalen = 0;             /* placate compiler warning */
        socketdata = sk_getxdmdata(xconn->s, &socketdatalen);
        if (socketdata && socketdatalen==6) {
            sprintf(new_peer_addr, "%d.%d.%d.%d", socketdata[0],
                    socketdata[1], socketdata[2], socketdata[3]);
            new_peer_port = GET_16BIT_MSB_FIRST(socketdata + 4);
        } else {
            strcpy(new_peer_addr, "0.0.0.0");
            new_peer_port = 0;
        }

        greeting = x11_make_greeting(xconn->firstpkt[0],
                                     protomajor, protominor,
                                     xconn->disp->localauthproto,
                                     xconn->disp->localauthdata,
                                     xconn->disp->localauthdatalen,
                                     new_peer_addr, new_peer_port,
                                     &greeting_len);

        sk_write(xconn->s, greeting, greeting_len);

        smemclr(greeting, greeting_len);
        sfree(greeting);

        /*
         * Now we're done.
         */
        xconn->verified = true;
    }

    /*
     * After initialisation, just copy data simply.
     */

    return sk_write(xconn->s, data, len);
}